

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorViewResultTypeNV
          (ValidationState_t *_,Instruction *inst)

{
  uint id;
  Instruction *pIVar1;
  char *pcVar2;
  spv_result_t sVar3;
  string local_220;
  DiagnosticStream local_200;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,0);
  pIVar1 = ValidationState_t::FindDef(_,id);
  if ((pIVar1 == (Instruction *)0x0) || (sVar3 = SPV_SUCCESS, (pIVar1->inst_).opcode != 0x14fb)) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    pcVar2 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator<<((ostream *)&local_200,pcVar2);
    std::operator<<((ostream *)&local_200," Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_220,_,id);
    std::operator<<((ostream *)&local_200,(string *)&local_220);
    std::operator<<((ostream *)&local_200," is not a tensor view type.");
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_200);
    sVar3 = local_200.error_;
  }
  return sVar3;
}

Assistant:

spv_result_t ValidateTensorViewResultTypeNV(ValidationState_t& _,
                                            const Instruction* inst) {
  const auto result_type_index = 0;
  const auto result_type_id = inst->GetOperandAs<uint32_t>(result_type_index);
  const auto result_type = _.FindDef(result_type_id);

  if (!result_type || spv::Op::OpTypeTensorViewNV != result_type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " is not a tensor view type.";
  }
  return SPV_SUCCESS;
}